

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O0

void shuff_interp_decode(bit_io_t *bio,uint64_t *A,uint64_t n)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  uint64_t uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint64_t in_RDX;
  undefined8 *in_RSI;
  uint64_t _B_x_1;
  int64_t _B_thresh;
  int64_t _B_logofb;
  int64_t _B_b;
  int64_t _B_x;
  uint64_t stack_pointer;
  int64_t j;
  int64_t range;
  int64_t mid;
  int64_t hi;
  int64_t lo;
  bit_io_t *in_stack_ffffffffffffff80;
  bit_io_t *bio_00;
  ulong local_70;
  uint64_t local_50;
  long local_48;
  long local_40;
  
  *in_RSI = 0;
  in_RSI[in_RDX] = 0x8000000;
  bio_00 = (bit_io_t *)shuff_interp_decode::ss;
  uVar4 = SHUFF_ceil_log2(in_RDX);
  if (bio_00 < (bit_io_t *)(uVar4 + 1)) {
    in_stack_ffffffffffffff80 = (bit_io_t *)shuff_interp_decode::s;
    uVar4 = SHUFF_ceil_log2(in_RDX);
    shuff_interp_decode::s = (stack *)realloc(in_stack_ffffffffffffff80,(uVar4 + 1) * 0x10);
    if (shuff_interp_decode::s == (stack *)0x0) {
      fprintf(_stderr,"Out of memory for stack\n");
      exit(-1);
    }
    uVar4 = SHUFF_ceil_log2(in_RDX);
    shuff_interp_decode::ss = uVar4 + 1;
  }
  shuff_interp_decode::s->lo = 0;
  shuff_interp_decode::s->hi = in_RDX;
  local_48 = 1;
  while (local_48 != 0) {
    lVar1 = shuff_interp_decode::s[local_48 + -1].lo;
    lVar2 = shuff_interp_decode::s[local_48 + -1].hi;
    lVar5 = local_48 + -1;
    lVar6 = (in_RSI[lVar2] - in_RSI[lVar1]) - ((lVar2 - lVar1) + -1);
    lVar7 = lVar1 + (lVar2 - lVar1 >> 1);
    if (lVar6 == 1) {
      in_RSI[lVar7] = 1;
    }
    else {
      bVar3 = 0;
      for (local_70 = lVar6 - 1; local_70 != 0; local_70 = local_70 >> 1) {
        bVar3 = bVar3 + 1;
      }
      lVar6 = (1 << (bVar3 & 0x1f)) - lVar6;
      local_50 = SHUFF_INPUT_ULONG(bio_00,(int64_t)in_stack_ffffffffffffff80);
      if (lVar6 <= (long)local_50) {
        uVar4 = SHUFF_INPUT_BIT(in_stack_ffffffffffffff80);
        local_50 = (local_50 * 2 + uVar4) - lVar6;
      }
      in_RSI[lVar7] = local_50 + 1;
    }
    in_RSI[lVar7] = in_RSI[lVar1] + (lVar7 - lVar1) + -1 + in_RSI[lVar7];
    lVar6 = lVar7;
    if (in_RSI[lVar2] - in_RSI[lVar7] == lVar2 - lVar7) {
      while (local_40 = lVar6 + 1, local_40 < lVar2) {
        in_RSI[local_40] = in_RSI[lVar6] + 1;
        lVar6 = local_40;
      }
    }
    else if (1 < lVar2 - lVar7) {
      shuff_interp_decode::s[lVar5].lo = lVar7;
      shuff_interp_decode::s[lVar5].hi = lVar2;
      lVar5 = local_48;
    }
    local_48 = lVar5;
    if (in_RSI[lVar7] - in_RSI[lVar1] == lVar7 - lVar1) {
      while (local_40 = lVar1 + 1, local_40 < lVar7) {
        in_RSI[local_40] = in_RSI[lVar1] + 1;
        lVar1 = local_40;
      }
    }
    else if (1 < lVar7 - lVar1) {
      shuff_interp_decode::s[local_48].lo = lVar1;
      shuff_interp_decode::s[local_48].hi = lVar7;
      local_48 = local_48 + 1;
    }
  }
  return;
}

Assistant:

void shuff_interp_decode(bit_io_t* bio, uint64_t A[], uint64_t n)
{
    int64_t lo, hi, mid, range, j;
    static stack* s = NULL;
    static uint64_t ss = 0;
    uint64_t stack_pointer = 0;

    A[0] = 0;
    A[n] = SHUFF_MAX_SYMBOL;

    SHUFF_CHECK_STACK_SIZE(SHUFF_ceil_log2(n) + 1);

    SHUFF_PUSH(0, n);
    while (SHUFF_STACK_NOT_EMPTY) {
        SHUFF_POP(lo, hi);
        range = A[hi] - A[lo] - (hi - lo - 1);
        mid = lo + ((hi - lo) >> 1);
        SHUFF_BINARY_DECODE(bio, A[mid], range);
        A[mid] += A[lo] + (mid - lo - 1);

        if (A[hi] - A[mid] == (uint64_t)(hi - mid)) // fill in the gaps of 1
            for (j = mid + 1; j < hi; j++)
                A[j] = A[j - 1] + 1;
        else if (hi - mid > 1)
            SHUFF_PUSH(mid, hi);

        if (A[mid] - A[lo] == (uint64_t)(mid - lo)) // fill in the gaps of 1
            for (j = lo + 1; j < mid; j++)
                A[j] = A[j - 1] + 1;
        else if (mid - lo > 1)
            SHUFF_PUSH(lo, mid);
    }
}